

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int obsolete_op_p(gen_ctx_t gen_ctx,MIR_op_t op,size_t def_insn_num)

{
  uint uVar1;
  int iVar2;
  
  if (op._8_1_ == '\v') {
    if ((op.u.mem.base != 0xffffffff) &&
       (iVar2 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,op.u.mem.base,def_insn_num),
       iVar2 != 0)) {
      return 1;
    }
    if ((op.u.mem.index != 0xffffffff) &&
       (iVar2 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,op.u.mem.index,def_insn_num),
       iVar2 != 0)) {
      return 1;
    }
    uVar1 = (uint)(def_insn_num < gen_ctx->combine_ctx->last_mem_ref_insn_num);
  }
  else {
    uVar1 = 0;
    if (op._8_1_ == '\x02') {
      iVar2 = obsolete_var_p((gen_ctx_t)gen_ctx->combine_ctx,op.u.reg,def_insn_num);
      return iVar2;
    }
  }
  return uVar1;
}

Assistant:

static int obsolete_op_p (gen_ctx_t gen_ctx, MIR_op_t op, size_t def_insn_num) {
  if (obsolete_var_op_p (gen_ctx, op, def_insn_num)) return TRUE;
  if (op.mode != MIR_OP_VAR_MEM) return FALSE;
  if (op.u.var_mem.base != MIR_NON_VAR && obsolete_var_p (gen_ctx, op.u.var_mem.base, def_insn_num))
    return TRUE;
  if (op.u.var_mem.index != MIR_NON_VAR
      && obsolete_var_p (gen_ctx, op.u.var_mem.index, def_insn_num))
    return TRUE;
  return last_mem_ref_insn_num > def_insn_num;
}